

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_interleave_h(dwt_t *h,int *a)

{
  int i;
  int *bi;
  int *ai;
  int *a_local;
  dwt_t *h_local;
  
  bi = h->mem + h->cas;
  i = h->sn;
  ai = a;
  while (i != 0) {
    *bi = *ai;
    bi = bi + 2;
    i = i + -1;
    ai = ai + 1;
  }
  bi = h->mem + (1 - (long)h->cas);
  i = h->dn;
  ai = a + h->sn;
  while (i != 0) {
    *bi = *ai;
    bi = bi + 2;
    i = i + -1;
    ai = ai + 1;
  }
  return;
}

Assistant:

static void dwt_interleave_h(dwt_t* h, int *a) {
    int *ai = a;
    int *bi = h->mem + h->cas;
    int  i	= h->sn;
    while( i-- ) {
      *bi = *(ai++);
	  bi += 2;
    }
    ai	= a + h->sn;
    bi	= h->mem + 1 - h->cas;
    i	= h->dn ;
    while( i-- ) {
      *bi = *(ai++);
	  bi += 2;
    }
}